

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestTestHandler::AddTest
          (cmCTestTestHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmCTest *pcVar1;
  bool bVar2;
  __type _Var3;
  const_reference __rhs;
  ostream *poVar4;
  const_reference pvVar5;
  char *pcVar6;
  reference pbVar7;
  bool collapse;
  string local_898 [32];
  undefined1 local_878 [8];
  ostringstream cmCTestLog_msg_3;
  string local_700;
  undefined1 local_6e0 [8];
  cmCTestTestProperties test;
  ostringstream local_520 [8];
  ostringstream cmCTestLog_msg_2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3a0;
  byte local_391;
  iterator iStack_390;
  bool found_1;
  iterator it_1;
  ostringstream local_368 [8];
  ostringstream cmCTestLog_msg_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e8;
  byte local_1d9;
  iterator iStack_1d8;
  bool found;
  iterator it;
  ostringstream local_1a0 [8];
  ostringstream cmCTestLog_msg;
  string *testname;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCTestTestHandler *this_local;
  
  __rhs = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](args,0);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar4 = std::operator<<((ostream *)local_1a0,"Add test: ");
  pvVar5 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](args,0);
  poVar4 = std::operator<<(poVar4,(string *)pvVar5);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x8dd,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string((string *)&it);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  if (((this->UseExcludeRegExpFlag & 1U) != 0) && ((this->UseExcludeRegExpFirst & 1U) != 0)) {
    pcVar6 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::RegularExpression::find(&this->ExcludeTestsRegularExpression,pcVar6);
    if (bVar2) {
      return true;
    }
  }
  if ((this->MemCheck & 1U) == 0) {
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::__normal_iterator(&stack0xfffffffffffffc70);
    local_391 = 0;
    local_3a0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(&this->CustomTestsIgnore);
    iStack_390 = (iterator)local_3a0;
    while( true ) {
      local_3a8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->CustomTestsIgnore);
      bVar2 = __gnu_cxx::operator!=(&stack0xfffffffffffffc70,&local_3a8);
      if (!bVar2) break;
      pbVar7 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&stack0xfffffffffffffc70);
      _Var3 = std::operator==(pbVar7,__rhs);
      if (_Var3) {
        local_391 = 1;
        break;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&stack0xfffffffffffffc70);
    }
    if ((local_391 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_520);
      poVar4 = std::operator<<((ostream *)local_520,"Ignore test: ");
      pbVar7 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&stack0xfffffffffffffc70);
      poVar4 = std::operator<<(poVar4,(string *)pbVar7);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x909,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string
                ((string *)&test.LockedResources._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::__cxx11::ostringstream::~ostringstream(local_520);
      return true;
    }
  }
  else {
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::__normal_iterator(&stack0xfffffffffffffe28);
    local_1d9 = 0;
    local_1e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin(&this->CustomTestsIgnore);
    iStack_1d8 = (iterator)local_1e8;
    while( true ) {
      local_1f0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->CustomTestsIgnore);
      bVar2 = __gnu_cxx::operator!=(&stack0xfffffffffffffe28,&local_1f0);
      if (!bVar2) break;
      pbVar7 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&stack0xfffffffffffffe28);
      _Var3 = std::operator==(pbVar7,__rhs);
      if (_Var3) {
        local_1d9 = 1;
        break;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&stack0xfffffffffffffe28);
    }
    if ((local_1d9 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_368);
      poVar4 = std::operator<<((ostream *)local_368,"Ignore memcheck: ");
      pbVar7 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&stack0xfffffffffffffe28);
      poVar4 = std::operator<<(poVar4,(string *)pbVar7);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,4,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
                   ,0x8f5,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
      std::__cxx11::string::~string((string *)&it_1);
      std::__cxx11::ostringstream::~ostringstream(local_368);
      return true;
    }
  }
  cmCTestTestProperties::cmCTestTestProperties((cmCTestTestProperties *)local_6e0);
  std::__cxx11::string::operator=((string *)local_6e0,(string *)__rhs);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&test.Directory.field_2 + 8),args);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&local_700,(SystemTools *)0x1,collapse);
  std::__cxx11::string::operator=
            ((string *)(test.Name.field_2._M_local_buf + 8),(string *)&local_700);
  std::__cxx11::string::~string((string *)&local_700);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_878);
  poVar4 = std::operator<<((ostream *)local_878,"Set test directory: ");
  poVar4 = std::operator<<(poVar4,(string *)(test.Name.field_2._M_local_buf + 8));
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar6 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x913,pcVar6,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string(local_898);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_878);
  test.Measurements._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 1;
  test.Measurements._M_t._M_impl.super__Rb_tree_header._M_node_count._1_1_ = 0;
  test.Cost._0_1_ = 0;
  test.PreviousRuns = 0;
  test.RunSerial = false;
  test._293_3_ = 0;
  test.Timeout._0_1_ = 0;
  test.Measurements._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
  test.ExplicitTimeout = true;
  test._305_3_ = 0;
  test.Index = -1;
  test.IsInBasedOnREOptions = false;
  test.WillFail = false;
  test._282_2_ = 0;
  if ((this->UseIncludeRegExpFlag & 1U) != 0) {
    pcVar6 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::RegularExpression::find(&this->IncludeTestsRegularExpression,pcVar6);
    if (!bVar2) {
      test.Measurements._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 0;
      goto LAB_0054ca80;
    }
  }
  if (((this->UseExcludeRegExpFlag & 1U) != 0) && ((this->UseExcludeRegExpFirst & 1U) == 0)) {
    pcVar6 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::RegularExpression::find(&this->ExcludeTestsRegularExpression,pcVar6);
    if (bVar2) {
      test.Measurements._M_t._M_impl.super__Rb_tree_header._M_node_count._0_1_ = 0;
    }
  }
LAB_0054ca80:
  std::
  vector<cmCTestTestHandler::cmCTestTestProperties,_std::allocator<cmCTestTestHandler::cmCTestTestProperties>_>
  ::push_back(&this->TestList,(value_type *)local_6e0);
  cmCTestTestProperties::~cmCTestTestProperties((cmCTestTestProperties *)local_6e0);
  return true;
}

Assistant:

bool cmCTestTestHandler::AddTest(const std::vector<std::string>& args)
{
  const std::string& testname = args[0];
  cmCTestOptionalLog(this->CTest, DEBUG, "Add test: " << args[0] << std::endl,
    this->Quiet);

  if (this->UseExcludeRegExpFlag &&
    this->UseExcludeRegExpFirst &&
    this->ExcludeTestsRegularExpression.find(testname.c_str()))
    {
    return true;
    }
  if ( this->MemCheck )
    {
    std::vector<std::string>::iterator it;
    bool found = false;
    for ( it = this->CustomTestsIgnore.begin();
      it != this->CustomTestsIgnore.end(); ++ it )
      {
      if ( *it == testname )
        {
        found = true;
        break;
        }
      }
    if ( found )
      {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
        "Ignore memcheck: " << *it << std::endl, this->Quiet);
      return true;
      }
    }
  else
    {
    std::vector<std::string>::iterator it;
    bool found = false;
    for ( it = this->CustomTestsIgnore.begin();
      it != this->CustomTestsIgnore.end(); ++ it )
      {
      if ( *it == testname )
        {
        found = true;
        break;
        }
      }
    if ( found )
      {
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT, "Ignore test: "
        << *it << std::endl, this->Quiet);
      return true;
      }
    }

  cmCTestTestProperties test;
  test.Name = testname;
  test.Args = args;
  test.Directory = cmSystemTools::GetCurrentWorkingDirectory();
  cmCTestOptionalLog(this->CTest, DEBUG, "Set test directory: "
    << test.Directory << std::endl, this->Quiet);

  test.IsInBasedOnREOptions = true;
  test.WillFail = false;
  test.RunSerial = false;
  test.Timeout = 0;
  test.ExplicitTimeout = false;
  test.Cost = 0;
  test.Processors = 1;
  test.SkipReturnCode = -1;
  test.PreviousRuns = 0;
  if (this->UseIncludeRegExpFlag &&
    !this->IncludeTestsRegularExpression.find(testname.c_str()))
    {
    test.IsInBasedOnREOptions = false;
    }
  else if (this->UseExcludeRegExpFlag &&
    !this->UseExcludeRegExpFirst &&
    this->ExcludeTestsRegularExpression.find(testname.c_str()))
    {
    test.IsInBasedOnREOptions = false;
    }
  this->TestList.push_back(test);
  return true;
}